

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O2

void __thiscall Diligent::GLContextState::SetDepthClamp(GLContextState *this,bool bEnableDepthClamp)

{
  bool bVar1;
  ENABLE_STATE EVar2;
  undefined7 in_register_00000031;
  GLenum err;
  string msg;
  
  EVar2 = DISABLED - (int)CONCAT71(in_register_00000031,bEnableDepthClamp);
  if ((this->m_RSState).DepthClampEnable.m_EnableState == EVar2) {
    return;
  }
  bVar1 = (this->m_Caps).IsDepthClampSupported;
  if (bEnableDepthClamp) {
    if (bVar1 == false) {
      FormatString<char[95]>
                (&msg,(char (*) [95])
                      "Depth clamp is not supported by this device. Check the value of the DepthClamp device feature."
                );
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0,0);
      }
    }
    else {
      glEnable();
      err = glGetError();
      if (err == 0) goto LAB_0015b6c9;
      LogError<false,char[29],char[17],unsigned_int>
                (false,"SetDepthClamp",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x2a4,(char (*) [29])"Failed to enable depth clamp",
                 (char (*) [17])"\nGL Error Code: ",&err);
      FormatString<char[6]>(&msg,(char (*) [6])0x2b552e);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"SetDepthClamp",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x2a4);
    }
  }
  else {
    if (bVar1 == false) goto LAB_0015b6c9;
    glDisable();
    err = glGetError();
    if (err == 0) goto LAB_0015b6c9;
    LogError<false,char[30],char[17],unsigned_int>
              (false,"SetDepthClamp",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x2b0,(char (*) [30])"Failed to disable depth clamp",
               (char (*) [17])"\nGL Error Code: ",&err);
    FormatString<char[6]>(&msg,(char (*) [6])0x2b552e);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SetDepthClamp",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x2b0);
  }
  std::__cxx11::string::~string((string *)&msg);
LAB_0015b6c9:
  (this->m_RSState).DepthClampEnable.m_EnableState = EVar2;
  return;
}

Assistant:

void GLContextState::SetDepthClamp(bool bEnableDepthClamp)
{
    if (m_RSState.DepthClampEnable != bEnableDepthClamp)
    {
        if (bEnableDepthClamp)
        {
            // Note that enabling depth clamping in GL is the same as
            // disabling clipping in Direct3D.
            // https://docs.microsoft.com/en-us/windows/win32/api/d3d11/ns-d3d11-d3d11_rasterizer_desc
            // https://www.khronos.org/opengl/wiki/GLAPI/glEnable
            if (m_Caps.IsDepthClampSupported)
            {
                glEnable(GL_DEPTH_CLAMP);
                DEV_CHECK_GL_ERROR("Failed to enable depth clamp");
            }
            else
            {
                LOG_WARNING_MESSAGE("Depth clamp is not supported by this device. Check the value of the DepthClamp device feature.");
            }
        }
        else
        {
            if (m_Caps.IsDepthClampSupported)
            {
                glDisable(GL_DEPTH_CLAMP);
                DEV_CHECK_GL_ERROR("Failed to disable depth clamp");
            }
        }
        m_RSState.DepthClampEnable = bEnableDepthClamp;
    }
}